

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::MessageTest_MergeEmptyMessageFromWire_Test::
~MessageTest_MergeEmptyMessageFromWire_Test(MessageTest_MergeEmptyMessageFromWire_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MessageTest, MergeEmptyMessageFromWire) {
  // Input wire tag: 9A 01 (hex) which is 10011010 00000001
  //   Field number 19 with wire type LEN
  // Explicitly specify LEN to be zero, then it's basically an empty message
  //   encoded on the wire.
  absl::string_view wire("\x9A\x01\x00", 3);

  TestAllTypes message;
  ASSERT_EQ(TestAllTypes::GetDescriptor()->FindFieldByNumber(19)->name(),
            "optional_foreign_message");
  message.MergeFromString(wire);

  // Message fields always have explicit presence, so serializing the message
  // will write the original bytes back out onto the wire.
  std::string output_data;
  EXPECT_TRUE(message.SerializeToString(&output_data));
  EXPECT_EQ(output_data, wire);
}